

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

void __thiscall
Catch::SonarQubeReporter::SonarQubeReporter(SonarQubeReporter *this,ReporterConfig *config)

{
  ReporterConfig RVar1;
  undefined1 auVar2 [16];
  
  (this->super_CumulativeReporterBase).super_IStreamingReporter.m_preferences.shouldRedirectStdOut =
       false;
  (this->super_CumulativeReporterBase).super_IStreamingReporter.m_preferences.
  shouldReportAllAssertions = false;
  RVar1 = *config;
  auVar2._0_8_ = RVar1.m_fullConfig;
  auVar2._8_4_ = (int)RVar1.m_stream;
  auVar2._12_4_ = RVar1.m_stream._4_4_;
  (this->super_CumulativeReporterBase).m_config = auVar2._0_8_;
  (this->super_CumulativeReporterBase).stream = (ostream *)auVar2._8_8_;
  memset(&(this->super_CumulativeReporterBase).m_assertions,0,0xb0);
  (this->super_CumulativeReporterBase).super_IStreamingReporter._vptr_IStreamingReporter =
       (_func_int **)&PTR__SonarQubeReporter_001f9b30;
  XmlWriter::XmlWriter(&this->xml,config->m_stream);
  (this->super_CumulativeReporterBase).super_IStreamingReporter.m_preferences.shouldRedirectStdOut =
       true;
  (this->super_CumulativeReporterBase).super_IStreamingReporter.m_preferences.
  shouldReportAllAssertions = true;
  return;
}

Assistant:

SonarQubeReporter(ReporterConfig const& config)
        : CumulativeReporterBase(config)
        , xml(config.stream()) {
            m_preferences.shouldRedirectStdOut = true;
            m_preferences.shouldReportAllAssertions = true;
        }